

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

ConstTokenOrSyntax * __thiscall
slang::syntax::PatternCaseItemSyntax::getChild(PatternCaseItemSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  undefined8 in_RDX;
  ConstTokenOrSyntax *in_RSI;
  Info *in_RDI;
  SyntaxNode *in_stack_ffffffffffffffa8;
  Info *pIVar1;
  
  pIVar1 = in_RDI;
  switch(in_RDX) {
  case 0:
    not_null<slang::syntax::PatternSyntax_*>::get
              ((not_null<slang::syntax::PatternSyntax_*> *)(in_RSI + 1));
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)in_RDI,in_stack_ffffffffffffffa8);
    break;
  case 1:
    token.info = in_RDI;
    token._0_8_ = in_stack_ffffffffffffffa8;
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)0x1f7b46,token);
    pIVar1 = in_RDI;
    break;
  case 2:
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)in_RDI,in_stack_ffffffffffffffa8);
    pIVar1 = in_RDI;
    break;
  case 3:
    token_00.info = in_RDI;
    token_00._0_8_ = in_stack_ffffffffffffffa8;
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)0x1f7b88,token_00);
    pIVar1 = in_RDI;
    break;
  case 4:
    not_null<slang::syntax::StatementSyntax_*>::get
              ((not_null<slang::syntax::StatementSyntax_*> *)(in_RSI + 3));
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)in_RDI,in_stack_ffffffffffffffa8);
    break;
  default:
    ConstTokenOrSyntax::ConstTokenOrSyntax(in_RSI,in_RDI);
    pIVar1 = in_RDI;
  }
  return (ConstTokenOrSyntax *)pIVar1;
}

Assistant:

ConstTokenOrSyntax PatternCaseItemSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return pattern.get();
        case 1: return tripleAnd;
        case 2: return expr;
        case 3: return colon;
        case 4: return statement.get();
        default: return nullptr;
    }
}